

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_rest_resp(Curl_easy *data,connectdata *conn,int ftpcode,ftpstate instate)

{
  CURLcode CVar1;
  size_t blen;
  char local_58 [8];
  char buffer [24];
  ftp_conn *ftpc;
  CURLcode result;
  ftpstate instate_local;
  int ftpcode_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if ((instate == '\x1a') || (instate != '\x1b')) {
    if (ftpcode == 0x15e) {
      builtin_strncpy(local_58,"Accept-r",8);
      builtin_strncpy(buffer,"anges: bytes\r\n",0xf);
      buffer[0xf] = '\0';
      blen = strlen(local_58);
      CVar1 = client_write_header(data,local_58,blen);
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
    }
    ftpc._4_4_ = ftp_state_prepare_transfer(data);
  }
  else if (ftpcode == 0x15e) {
    ftpc._4_4_ = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"RETR %s",(conn->proto).ftpc.file);
    if (ftpc._4_4_ == CURLE_OK) {
      _ftp_state(data,' ');
    }
  }
  else {
    Curl_failf(data,"Couldn\'t use REST");
    ftpc._4_4_ = CURLE_FTP_COULDNT_USE_REST;
  }
  return ftpc._4_4_;
}

Assistant:

static CURLcode ftp_state_rest_resp(struct Curl_easy *data,
                                    struct connectdata *conn,
                                    int ftpcode,
                                    ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  switch(instate) {
  case FTP_REST:
  default:
#ifdef CURL_FTP_HTTPSTYLE_HEAD
    if(ftpcode == 350) {
      char buffer[24]= { "Accept-ranges: bytes\r\n" };
      result = client_write_header(data, buffer, strlen(buffer));
      if(result)
        return result;
    }
#endif
    result = ftp_state_prepare_transfer(data);
    break;

  case FTP_RETR_REST:
    if(ftpcode != 350) {
      failf(data, "Couldn't use REST");
      result = CURLE_FTP_COULDNT_USE_REST;
    }
    else {
      result = Curl_pp_sendf(data, &ftpc->pp, "RETR %s", ftpc->file);
      if(!result)
        ftp_state(data, FTP_RETR);
    }
    break;
  }

  return result;
}